

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void __thiscall Router::Router(Router *this)

{
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  *this_00;
  vector<Vec2,_std::allocator<Vec2>_> *this_01;
  pointer *ppVVar1;
  pointer pVVar2;
  pointer pvVar3;
  float *pfVar4;
  iterator iVar5;
  long lVar6;
  pointer pvVar7;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *pvVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  vector<Vec2,_std::allocator<Vec2>_> *pvVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  Vec2 t3;
  Vec2 t2;
  Vec2 t1;
  Vec2 t0;
  Vec2 local_78;
  Vec2 local_70;
  Vec2 local_68;
  Vec2 local_60;
  uint local_54;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  this_00 = &this->Obstacles;
  this_01 = &this->Vertexes;
  local_50 = &this->Edges;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ObstacleCount = 0xb;
  std::
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ::resize(this_00,0xb);
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 0.0;
  pVVar2->y = 0.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 0.0;
  pVVar2[1].y = 7.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 21.0;
  pVVar2[2].y = 7.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 21.0;
  pVVar2[3].y = 0.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 15.0;
  pVVar2->y = 9.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 15.0;
  pVVar2[1].y = 17.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 25.5;
  pVVar2[2].y = 17.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 25.5;
  pVVar2[3].y = 9.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 2;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 0.0;
  pVVar2->y = 11.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 0.0;
  pVVar2[1].y = 22.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 15.0;
  pVVar2[2].y = 22.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 15.0;
  pVVar2[3].y = 11.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 3;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 0.0;
  pVVar2->y = 22.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 0.0;
  pVVar2[1].y = 29.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 25.5;
  pVVar2[2].y = 29.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 25.5;
  pVVar2[3].y = 22.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 4;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 31.0;
  pVVar2->y = 7.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 31.0;
  pVVar2[1].y = 28.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 42.0;
  pVVar2[2].y = 28.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 42.0;
  pVVar2[3].y = 7.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 5;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 42.0;
  pVVar2->y = 0.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 42.0;
  pVVar2[1].y = 52.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 60.0;
  pVVar2[2].y = 52.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 60.0;
  pVVar2[3].y = 0.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 6;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 22.0;
  pVVar2->y = 31.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 22.0;
  pVVar2[1].y = 48.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 39.0;
  pVVar2[2].y = 48.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 39.0;
  pVVar2[3].y = 31.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 7;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 0.0;
  pVVar2->y = 44.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 0.0;
  pVVar2[1].y = 54.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 10.0;
  pVVar2[2].y = 54.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 10.0;
  pVVar2[3].y = 44.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 8;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 0.0;
  pVVar2->y = 54.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 0.0;
  pVVar2[1].y = 90.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 23.0;
  pVVar2[2].y = 90.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 23.0;
  pVVar2[3].y = 54.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 9;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 27.0;
  pVVar2->y = 86.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 27.0;
  pVVar2[1].y = 90.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 60.0;
  pVVar2[2].y = 90.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 60.0;
  pVVar2[3].y = 86.0;
  pvVar13 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 10;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar13,4);
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2->x = 37.0;
  pVVar2->y = 68.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[1].x = 37.0;
  pVVar2[1].y = 82.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].x = 51.0;
  pVVar2[2].y = 82.0;
  pVVar2 = (pvVar13->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[3].x = 51.0;
  pVVar2[3].y = 68.0;
  if (0 < this->ObstacleCount) {
    lVar14 = 0;
    lVar12 = 0;
    do {
      pvVar3 = (this_00->
               super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar4 = *(float **)
                ((long)&(pvVar3->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                        super__Vector_impl_data + lVar14);
      fVar17 = *pfVar4 + -0.05;
      fVar18 = pfVar4[1] + -0.05;
      local_60.y = fVar18;
      local_60.x = fVar17;
      lVar15 = *(long *)((long)&(pvVar3->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                                super__Vector_impl_data + lVar14);
      local_68.y = *(float *)(lVar15 + 0xc) + 0.05;
      local_68.x = *(float *)(lVar15 + 8) + -0.05;
      lVar15 = *(long *)((long)&(pvVar3->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                                super__Vector_impl_data + lVar14);
      local_70.y = *(float *)(lVar15 + 0x14) + 0.05;
      local_70.x = *(float *)(lVar15 + 0x10) + 0.05;
      lVar15 = *(long *)((long)&(pvVar3->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                                super__Vector_impl_data + lVar14);
      local_78.y = *(float *)(lVar15 + 0x1c) + -0.05;
      local_78.x = *(float *)(lVar15 + 0x18) + 0.05;
      if ((((0.0 <= fVar17) && (fVar17 <= 60.0)) && (0.0 <= fVar18)) && (fVar18 <= 90.0)) {
        iVar5._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar5,&local_60);
        }
        else {
          *iVar5._M_current = local_60;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      if (((0.0 <= local_68.x) && (local_68.x <= 60.0)) &&
         ((0.0 <= local_68.y && (local_68.y <= 90.0)))) {
        iVar5._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar5,&local_68);
        }
        else {
          *iVar5._M_current = local_68;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      if (((0.0 <= local_70.x) && (local_70.x <= 60.0)) &&
         ((0.0 <= local_70.y && (local_70.y <= 90.0)))) {
        iVar5._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar5,&local_70);
        }
        else {
          *iVar5._M_current = local_70;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      if ((((0.0 <= local_78.x) && (local_78.x <= 60.0)) && (0.0 <= local_78.y)) &&
         (local_78.y <= 90.0)) {
        iVar5._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar5,&local_78);
        }
        else {
          *iVar5._M_current = local_78;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0x18;
    } while (lVar12 < this->ObstacleCount);
  }
  pvVar8 = local_50;
  iVar10 = (int)((ulong)((long)(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->VertexCount = iVar10;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(local_50,(long)iVar10);
  uVar11 = (ulong)(uint)this->VertexCount;
  if (0 < this->VertexCount) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&(((pvVar8->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data + lVar12),(long)(int)uVar11);
      lVar14 = lVar14 + 1;
      uVar11 = (ulong)this->VertexCount;
      lVar12 = lVar12 + 0x18;
    } while (lVar14 < (long)uVar11);
  }
  if (0 < this->VertexCount) {
    local_48 = 1;
    lVar12 = 0;
    do {
      local_40 = lVar12 + 1;
      if (local_40 < this->VertexCount) {
        local_38 = lVar12 * 3;
        lVar14 = local_40;
        lVar15 = local_48;
        do {
          if (this->ObstacleCount < 1) {
LAB_001063d7:
            pVVar2 = (this_01->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            fVar17 = pVVar2[lVar12].x - pVVar2[lVar15].x;
            fVar18 = pVVar2[lVar12].y - pVVar2[lVar15].y;
            fVar17 = fVar17 * fVar17 + fVar18 * fVar18;
            if (fVar17 < 0.0) {
              fVar17 = sqrtf(fVar17);
            }
            else {
              fVar17 = SQRT(fVar17);
            }
          }
          else {
            uVar11 = CONCAT71((int7)((ulong)lVar14 >> 8),1);
            lVar14 = 0;
            do {
              local_54 = (uint)uVar11;
              lVar16 = 1;
              do {
                if (lVar16 == 5) {
                  uVar11 = (ulong)local_54;
                  goto LAB_001063b5;
                }
                pVVar2 = (this_01->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                lVar6 = *(long *)&(this_00->
                                  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar14].
                                  super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                                  super__Vector_impl_data;
                bVar9 = intersect(pVVar2[lVar12],pVVar2[lVar15],*(Vec2 *)(lVar6 + -8 + lVar16 * 8),
                                  *(Vec2 *)(lVar6 + (ulong)((uint)lVar16 & 3) * 8));
                lVar16 = lVar16 + 1;
              } while (!bVar9);
              uVar11 = 0;
LAB_001063b5:
            } while (((uVar11 & 1) != 0) && (lVar14 = lVar14 + 1, lVar14 < this->ObstacleCount));
            fVar17 = 1e+08;
            if ((uVar11 & 1) != 0) goto LAB_001063d7;
          }
          pvVar7 = (this->Edges).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(float *)(*(long *)&pvVar7[lVar15].super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data + lVar12 * 4) = fVar17;
          *(float *)(*(long *)((long)&(pvVar7->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data + local_38 * 8) + lVar15 * 4)
               = fVar17;
          lVar15 = lVar15 + 1;
          lVar14 = local_38;
        } while ((int)lVar15 < this->VertexCount);
      }
      local_48 = local_48 + 1;
      lVar12 = local_40;
    } while (local_40 < this->VertexCount);
  }
  return;
}

Assistant:

Router::Router()
{
    ObstacleCount = 11;
    Obstacles.resize(ObstacleCount);

    setObstacle(Obstacles[0],  0,  0, 21,  7);
    setObstacle(Obstacles[1], 15,  9, 25.5, 17);
    setObstacle(Obstacles[2],  0, 11, 15, 22);
    setObstacle(Obstacles[3],  0, 22, 25.5, 29);
    setObstacle(Obstacles[4], 31,  7, 42, 28);
    setObstacle(Obstacles[5], 42,  0, 60, 52);
    setObstacle(Obstacles[6], 22, 31, 39, 48);
    setObstacle(Obstacles[7],  0, 44, 10, 54);
    setObstacle(Obstacles[8],  0, 54, 23, 90);
    setObstacle(Obstacles[9], 27, 86, 60, 90);
    setObstacle(Obstacles[10],37, 68, 51, 82);

    for (int i = 0; i < ObstacleCount; ++i)
    {
        Vec2 t0 = Obstacles[i][0] + Vec2(-ObsBorder, -ObsBorder);
        Vec2 t1 = Obstacles[i][1] + Vec2(-ObsBorder, ObsBorder);
        Vec2 t2 = Obstacles[i][2] + Vec2(ObsBorder, ObsBorder);
        Vec2 t3 = Obstacles[i][3] + Vec2(ObsBorder, -ObsBorder);
#define CHECK(t) if (t.x >= 0 && t.x <= MapWidth && t.y >= 0 && t.y <= MapHeight) Vertexes.push_back(t);
        CHECK(t0)
        CHECK(t1)
        CHECK(t2)
        CHECK(t3)
#undef CHECK
    }
    VertexCount = Vertexes.size();
    Edges.resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        Edges[i].resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        for (int j = i + 1; j < VertexCount; ++j)
        {
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(Vertexes[i], Vertexes[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
                        flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            Edges[i][j] = Edges[j][i] = (flag ? (Vertexes[i] - Vertexes[j]).length() : FINF);
        }
}